

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_esni_init_context
              (ptls_context_t *ctx,ptls_esni_context_t *esni,ptls_iovec_t esni_keys,
              ptls_key_exchange_context_t **key_exchanges)

{
  uint8_t **ppuVar1;
  void *pvVar2;
  uint8_t **ppuVar3;
  long in_RCX;
  long in_RDX;
  byte *pbVar4;
  uint8_t **ppuVar5;
  undefined8 *in_RSI;
  long in_RDI;
  long *in_R8;
  size_t i_1;
  uint8_t *end_6;
  uint8_t *_src_5;
  uint64_t _block_size64_5;
  size_t _block_size_5;
  size_t _capacity_5;
  uint16_t ext_type;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  size_t i;
  uint16_t id_1;
  void *newp;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  ptls_key_exchange_context_t **found;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint16_t id;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  size_t num_cipher_suites;
  size_t num_key_exchanges;
  uint8_t *end;
  uint8_t *src;
  uint8_t *in_stack_fffffffffffffe88;
  long lVar6;
  uint8_t **in_stack_fffffffffffffe90;
  uint64_t *in_stack_fffffffffffffe98;
  void *in_stack_fffffffffffffea0;
  ptls_hash_algorithm_t *in_stack_fffffffffffffea8;
  ptls_esni_context_t *in_stack_fffffffffffffeb0;
  ulong local_128;
  long local_120;
  long local_118;
  short local_10a;
  ulong local_e8;
  long local_e0;
  long *local_d8;
  ulong local_b8;
  long local_b0;
  short local_a2;
  ulong local_88;
  long local_80;
  ulong local_60;
  long local_58;
  int local_4c;
  long local_48;
  long local_40;
  uint8_t **local_30;
  
  ppuVar1 = (uint8_t **)(in_RDX + in_RCX);
  for (local_40 = 0; in_R8[local_40] != 0; local_40 = local_40 + 1) {
  }
  memset(in_RSI,0,0x30);
  pvVar2 = malloc((local_40 + 1) * 8);
  *in_RSI = pvVar2;
  if (pvVar2 == (void *)0x0) {
    local_4c = 0x201;
  }
  else {
    memcpy((void *)*in_RSI,in_R8,(local_40 + 1) * 8);
    local_4c = ptls_decode16((uint16_t *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88);
    if (local_4c == 0) {
      if ((long)ppuVar1 - in_RDX < 4) {
        local_4c = 0x33;
      }
      else {
        local_58 = 2;
        if ((ulong)((long)ppuVar1 - (in_RDX + 4)) < 2) {
          local_4c = 0x32;
        }
        else {
          local_60 = 0;
          local_30 = (uint8_t **)(in_RDX + 4);
          do {
            pbVar4 = (byte *)((long)local_30 + 1);
            local_60 = local_60 << 8 | (ulong)*(byte *)local_30;
            local_58 = local_58 + -1;
            local_30 = (uint8_t **)pbVar4;
          } while (local_58 != 0);
          if ((ulong)((long)ppuVar1 - (long)pbVar4) < local_60) {
            local_4c = 0x32;
          }
          else {
            local_80 = 2;
            if ((ulong)((long)ppuVar1 - (long)(pbVar4 + local_60)) < 2) {
              local_4c = 0x32;
            }
            else {
              local_88 = 0;
              local_30 = (uint8_t **)(pbVar4 + local_60);
              do {
                ppuVar3 = (uint8_t **)((long)local_30 + 1);
                local_88 = local_88 << 8 | (ulong)*(byte *)local_30;
                local_80 = local_80 + -1;
                local_30 = ppuVar3;
              } while (local_80 != 0);
              local_48 = 0;
              if ((ulong)((long)ppuVar1 - (long)ppuVar3) < local_88) {
                local_4c = 0x32;
              }
              else {
                ppuVar3 = (uint8_t **)((long)ppuVar3 + local_88);
                do {
                  local_4c = ptls_decode16((uint16_t *)in_stack_fffffffffffffe98,
                                           in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
                  if (local_4c != 0) goto LAB_00115022;
                  local_b0 = 2;
                  if ((ulong)((long)ppuVar3 - (long)local_30) < 2) {
                    local_4c = 0x32;
                    goto LAB_00115022;
                  }
                  local_b8 = 0;
                  do {
                    ppuVar5 = (uint8_t **)((long)local_30 + 1);
                    local_b8 = local_b8 << 8 | (ulong)*(byte *)local_30;
                    local_b0 = local_b0 + -1;
                    local_30 = ppuVar5;
                  } while (local_b0 != 0);
                  if ((ulong)((long)ppuVar3 - (long)ppuVar5) < local_b8) {
                    local_4c = 0x32;
                    goto LAB_00115022;
                  }
                  local_30 = (uint8_t **)((long)ppuVar5 + local_b8);
                  for (local_d8 = in_R8; (*local_d8 != 0 && (**(short **)*local_d8 != local_a2));
                      local_d8 = local_d8 + 1) {
                  }
                  if (local_d8 == (long *)0x0) {
                    local_4c = 0x204;
                    goto LAB_00115022;
                  }
                } while (local_30 != ppuVar3);
                if (local_30 == ppuVar3) {
                  local_e0 = 2;
                  if ((ulong)((long)ppuVar1 - (long)local_30) < 2) {
                    local_4c = 0x32;
                  }
                  else {
                    local_e8 = 0;
                    do {
                      ppuVar3 = (uint8_t **)((long)local_30 + 1);
                      local_e8 = local_e8 << 8 | (ulong)*(byte *)local_30;
                      local_e0 = local_e0 + -1;
                      local_30 = ppuVar3;
                    } while (local_e0 != 0);
                    if ((ulong)((long)ppuVar1 - (long)ppuVar3) < local_e8) {
                      local_4c = 0x32;
                    }
                    else {
                      do {
                        local_4c = ptls_decode16((uint16_t *)in_stack_fffffffffffffe98,
                                                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88
                                                );
                        if (local_4c != 0) goto LAB_00115022;
                        local_118 = 0;
                        while ((*(long *)(*(long *)(in_RDI + 0x18) + local_118 * 8) != 0 &&
                               (**(short **)(*(long *)(in_RDI + 0x18) + local_118 * 8) != local_10a)
                               )) {
                          local_118 = local_118 + 1;
                        }
                        if (*(long *)(*(long *)(in_RDI + 0x18) + local_118 * 8) != 0) {
                          pvVar2 = realloc((void *)in_RSI[1],(local_48 + 1) * 0x48);
                          if (pvVar2 == (void *)0x0) {
                            local_4c = 0x201;
                            goto LAB_00115022;
                          }
                          in_RSI[1] = pvVar2;
                          *(undefined8 *)(in_RSI[1] + local_48 * 0x48) =
                               *(undefined8 *)(*(long *)(in_RDI + 0x18) + local_118 * 8);
                          local_48 = local_48 + 1;
                        }
                      } while (ppuVar3 != (uint8_t **)((long)ppuVar3 + local_e8));
                      pvVar2 = realloc((void *)in_RSI[1],(local_48 + 1) * 0x48);
                      if (pvVar2 == (void *)0x0) {
                        local_4c = 0x201;
                      }
                      else {
                        in_RSI[1] = pvVar2;
                        *(undefined8 *)(in_RSI[1] + local_48 * 0x48) = 0;
                        if (ppuVar3 == (uint8_t **)((long)ppuVar3 + local_e8)) {
                          local_4c = ptls_decode16((uint16_t *)in_stack_fffffffffffffe98,
                                                   in_stack_fffffffffffffe90,
                                                   in_stack_fffffffffffffe88);
                          if (((local_4c == 0) &&
                              (local_4c = ptls_decode64(in_stack_fffffffffffffe98,
                                                        in_stack_fffffffffffffe90,
                                                        in_stack_fffffffffffffe88), local_4c == 0))
                             && (local_4c = ptls_decode64(in_stack_fffffffffffffe98,
                                                          in_stack_fffffffffffffe90,
                                                          in_stack_fffffffffffffe88), local_4c == 0)
                             ) {
                            local_120 = 2;
                            if ((ulong)((long)ppuVar1 - (long)ppuVar3) < 2) {
                              local_4c = 0x32;
                            }
                            else {
                              local_128 = 0;
                              do {
                                ppuVar3 = (uint8_t **)((long)local_30 + 1);
                                local_128 = local_128 << 8 | (ulong)*(byte *)local_30;
                                local_120 = local_120 + -1;
                                local_30 = ppuVar3;
                              } while (local_120 != 0);
                              if ((ulong)((long)ppuVar1 - (long)ppuVar3) < local_128) {
                                local_4c = 0x32;
                              }
                              else {
                                ppuVar3 = (uint8_t **)((long)ppuVar3 + local_128);
                                while (local_30 != ppuVar3) {
                                  local_4c = ptls_decode16((uint16_t *)in_stack_fffffffffffffe98,
                                                           in_stack_fffffffffffffe90,
                                                           in_stack_fffffffffffffe88);
                                  if (local_4c != 0) goto LAB_00115022;
                                  in_stack_fffffffffffffeb0 = (ptls_esni_context_t *)0x2;
                                  if ((ulong)((long)ppuVar3 - (long)local_30) < 2) {
                                    local_4c = 0x32;
                                    goto LAB_00115022;
                                  }
                                  in_stack_fffffffffffffea8 = (ptls_hash_algorithm_t *)0x0;
                                  do {
                                    in_stack_fffffffffffffe90 = (uint8_t **)((long)local_30 + 1);
                                    in_stack_fffffffffffffea8 =
                                         (ptls_hash_algorithm_t *)
                                         ((long)in_stack_fffffffffffffea8 << 8 |
                                         (ulong)*(byte *)local_30);
                                    in_stack_fffffffffffffeb0 =
                                         (ptls_esni_context_t *)
                                         &in_stack_fffffffffffffeb0[-1].field_0x2f;
                                    local_30 = in_stack_fffffffffffffe90;
                                  } while (in_stack_fffffffffffffeb0 != (ptls_esni_context_t *)0x0);
                                  in_stack_fffffffffffffeb0 = (ptls_esni_context_t *)0x0;
                                  if ((ptls_hash_algorithm_t *)
                                      ((long)ppuVar3 - (long)in_stack_fffffffffffffe90) <
                                      in_stack_fffffffffffffea8) {
                                    local_4c = 0x32;
                                    goto LAB_00115022;
                                  }
                                  in_stack_fffffffffffffe90 =
                                       (uint8_t **)
                                       ((long)in_stack_fffffffffffffe90 +
                                       (long)in_stack_fffffffffffffea8);
                                  local_30 = in_stack_fffffffffffffe90;
                                }
                                if (local_30 == ppuVar3) {
                                  if (local_30 == ppuVar1) {
                                    for (lVar6 = 0; *(long *)(in_RSI[1] + lVar6 * 0x48) != 0;
                                        lVar6 = lVar6 + 1) {
                                      local_4c = ptls_calc_hash(in_stack_fffffffffffffea8,
                                                                in_stack_fffffffffffffea0,
                                                                in_stack_fffffffffffffe98,
                                                                (size_t)in_stack_fffffffffffffe90);
                                      if (local_4c != 0) goto LAB_00115022;
                                    }
                                    local_4c = 0;
                                  }
                                  else {
                                    local_4c = 0x32;
                                  }
                                }
                                else {
                                  local_4c = 0x32;
                                }
                              }
                            }
                          }
                        }
                        else {
                          local_4c = 0x32;
                        }
                      }
                    }
                  }
                }
                else {
                  local_4c = 0x32;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00115022:
  if (local_4c != 0) {
    ptls_esni_dispose_context(in_stack_fffffffffffffeb0);
  }
  return local_4c;
}

Assistant:

int ptls_esni_init_context(ptls_context_t *ctx, ptls_esni_context_t *esni, ptls_iovec_t esni_keys,
                           ptls_key_exchange_context_t **key_exchanges)
{
    const uint8_t *src = esni_keys.base, *const end = src + esni_keys.len;
    size_t num_key_exchanges, num_cipher_suites = 0;
    int ret;

    for (num_key_exchanges = 0; key_exchanges[num_key_exchanges] != NULL; ++num_key_exchanges)
        ;

    memset(esni, 0, sizeof(*esni));
    if ((esni->key_exchanges = malloc(sizeof(*esni->key_exchanges) * (num_key_exchanges + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(esni->key_exchanges, key_exchanges, sizeof(*esni->key_exchanges) * (num_key_exchanges + 1));

    /* ESNIKeys */
    if ((ret = ptls_decode16(&esni->version, &src, end)) != 0)
        goto Exit;
    /* Skip checksum fields */
    if (end - src < 4) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    src += 4;
    /* Published SNI field */
    ptls_decode_open_block(src, end, 2, { src = end; });

    /* Process the list of KeyShareEntries, verify for each of them that the ciphersuite is supported. */
    ptls_decode_open_block(src, end, 2, {
        do {
            /* parse */
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
            /* check that matching key-share exists */
            ptls_key_exchange_context_t **found;
            for (found = key_exchanges; *found != NULL; ++found)
                if ((*found)->algo->id == id)
                    break;
            if (found == NULL) {
                ret = PTLS_ERROR_INCOMPATIBLE_KEY;
                goto Exit;
            }
        } while (src != end);
    });
    /* Process the list of cipher_suites. If they are supported, store in esni context  */
    ptls_decode_open_block(src, end, 2, {
        void *newp;
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            size_t i;
            for (i = 0; ctx->cipher_suites[i] != NULL; ++i)
                if (ctx->cipher_suites[i]->id == id)
                    break;
            if (ctx->cipher_suites[i] != NULL) {
                if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                esni->cipher_suites = newp;
                esni->cipher_suites[num_cipher_suites++].cipher_suite = ctx->cipher_suites[i];
            }
        } while (src != end);
        if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        esni->cipher_suites = newp;
        esni->cipher_suites[num_cipher_suites].cipher_suite = NULL;
    });
    /* Parse the padded length, not before, not after parameters */
    if ((ret = ptls_decode16(&esni->padded_length, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_before, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_after, &src, end)) != 0)
        goto Exit;
    /* Skip the extension fields */
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t ext_type;
            if ((ret = ptls_decode16(&ext_type, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    { /* calculate digests for every cipher-suite */
        size_t i;
        for (i = 0; esni->cipher_suites[i].cipher_suite != NULL; ++i) {
            if ((ret = ptls_calc_hash(esni->cipher_suites[i].cipher_suite->hash, esni->cipher_suites[i].record_digest,
                                      esni_keys.base, esni_keys.len)) != 0)
                goto Exit;
        }
    }

    ret = 0;
Exit:
    if (ret != 0)
        ptls_esni_dispose_context(esni);
    return ret;
}